

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O3

SourceLocation __thiscall
slang::SourceManager::createExpansionLoc
          (SourceManager *this,SourceLocation originalLoc,SourceRange expansionRange,bool isMacroArg
          )

{
  SourceLocation SVar1;
  unique_lock<std::shared_mutex> lock;
  unique_lock<std::shared_mutex> local_70;
  ExpansionInfo local_60;
  
  local_70._M_owns = false;
  local_70._M_device = &this->mutex;
  std::unique_lock<std::shared_mutex>::lock(&local_70);
  local_70._M_owns = true;
  local_60.macroName._M_len = 0;
  local_60.macroName._M_str = (char *)0x0;
  local_60.originalLoc = originalLoc;
  local_60.expansionRange.startLoc = expansionRange.startLoc;
  local_60.expansionRange.endLoc = expansionRange.endLoc;
  local_60.isMacroArg = isMacroArg;
  std::
  vector<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
  ::emplace_back<slang::SourceManager::ExpansionInfo>(&this->bufferEntries,&local_60);
  SVar1._0_4_ = (int)((ulong)((long)(this->bufferEntries).
                                    super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->bufferEntries).
                                   super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 6) - 1U & 0xfffffff
  ;
  SVar1._4_4_ = 0;
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_70);
  return SVar1;
}

Assistant:

SourceLocation SourceManager::createExpansionLoc(SourceLocation originalLoc,
                                                 SourceRange expansionRange, bool isMacroArg) {
    std::unique_lock<std::shared_mutex> lock(mutex);

    bufferEntries.emplace_back(ExpansionInfo(originalLoc, expansionRange, isMacroArg));
    return SourceLocation(BufferID((uint32_t)(bufferEntries.size() - 1), ""sv), 0);
}